

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledInputFile::setFrameBuffer(DeepTiledInputFile *this,DeepFrameBuffer *frameBuffer)

{
  double fv;
  PixelType PVar1;
  size_t xs;
  size_t ys;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  Slice *pSVar6;
  ArgExc *pAVar7;
  char *pcVar8;
  char *pcVar9;
  DeepSlice *pDVar10;
  TInSliceInfo *pTVar11;
  Channel *pCVar12;
  size_type sVar13;
  reference ppTVar14;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_2;
  bool fill;
  ConstIterator j_1;
  ConstIterator i;
  vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s;
  ConstIterator i_1;
  ConstIterator j;
  ChannelList *channels;
  Lock lock;
  DeepFrameBuffer *in_stack_fffffffffffffb28;
  uint in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  uint in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  byte local_46a;
  undefined7 in_stack_fffffffffffffbc8;
  byte in_stack_fffffffffffffbcf;
  DeepSlice *in_stack_fffffffffffffbd0;
  PixelType local_3ec;
  char *in_stack_fffffffffffffc30;
  ChannelList *in_stack_fffffffffffffc38;
  ulong local_270;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  const_iterator local_68;
  const_iterator local_60;
  const_iterator local_58;
  const_iterator local_50;
  ChannelList *local_38;
  DeepFrameBuffer *local_20;
  
  local_20 = in_RSI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
             (Mutex *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             SUB41((uint)in_stack_fffffffffffffb34 >> 0x18,0));
  local_38 = Header::channels((Header *)0x1cfd2b);
  local_50._M_node = (_Base_ptr)DeepFrameBuffer::begin(in_stack_fffffffffffffb28);
  do {
    local_58._M_node = (_Base_ptr)DeepFrameBuffer::end(in_stack_fffffffffffffb28);
    bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                (ConstIterator *)in_stack_fffffffffffffb28);
    if (!bVar2) {
      pSVar6 = DeepFrameBuffer::getSampleCountSlice(local_20);
      if (pSVar6->base == (char *)0x0) {
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc
                  (pAVar7,"Invalid base pointer, please set a proper sample count slice.");
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      *(char **)(*(long *)(in_RDI + 8) + 400) = pSVar6->base;
      *(size_t *)(*(long *)(in_RDI + 8) + 0x198) = pSVar6->xStride;
      *(size_t *)(*(long *)(in_RDI + 8) + 0x1a0) = pSVar6->yStride;
      *(uint *)(*(long *)(in_RDI + 8) + 0x1a8) = (uint)(pSVar6->xTileCoords & 1);
      *(uint *)(*(long *)(in_RDI + 8) + 0x1ac) = (uint)(pSVar6->yTileCoords & 1);
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ::vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                *)0x1d018e);
      ChannelList::begin((ChannelList *)in_stack_fffffffffffffb28);
      DeepFrameBuffer::begin(in_stack_fffffffffffffb28);
      while( true ) {
        DeepFrameBuffer::end(in_stack_fffffffffffffb28);
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                    (ConstIterator *)in_stack_fffffffffffffb28);
        if (!bVar2) break;
        while( true ) {
          ChannelList::end((ChannelList *)in_stack_fffffffffffffb28);
          bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                      (ConstIterator *)in_stack_fffffffffffffb28);
          bVar2 = false;
          if (bVar3) {
            pcVar8 = ChannelList::ConstIterator::name((ConstIterator *)0x1d029c);
            pcVar9 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1d02b3);
            iVar4 = strcmp(pcVar8,pcVar9);
            bVar2 = iVar4 < 0;
          }
          if (!bVar2) break;
          pTVar11 = (TInSliceInfo *)operator_new(0x40);
          pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d0310);
          PVar1 = pCVar12->type;
          pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d0338);
          in_stack_fffffffffffffb30 = 0;
          in_stack_fffffffffffffb28 = (DeepFrameBuffer *)0x0;
          anon_unknown_8::TInSliceInfo::TInSliceInfo
                    (pTVar11,PVar1,(char *)0x0,pCVar12->type,0,0,0,false,true,0.0,0,0);
          std::
          vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
          ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                       *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                      (value_type *)in_stack_fffffffffffffb28);
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))
          ;
        }
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb28);
        bVar3 = Imf_2_5::operator==((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                    (ConstIterator *)in_stack_fffffffffffffb28);
        bVar2 = true;
        if (!bVar3) {
          pcVar8 = ChannelList::ConstIterator::name((ConstIterator *)0x1d0486);
          pcVar9 = DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1d049d);
          iVar4 = strcmp(pcVar8,pcVar9);
          bVar2 = 0 < iVar4;
        }
        pTVar11 = (TInSliceInfo *)operator_new(0x40);
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d04ff);
        PVar1 = (pDVar10->super_Slice).type;
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d0527);
        pcVar8 = (pDVar10->super_Slice).base;
        if (bVar2) {
          pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d055c);
          local_3ec = (pDVar10->super_Slice).type;
        }
        else {
          pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d0586);
          local_3ec = pCVar12->type;
        }
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d05bc);
        xs = (pDVar10->super_Slice).xStride;
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d05e7);
        ys = (pDVar10->super_Slice).yStride;
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d0612);
        in_stack_fffffffffffffb28 =
             (DeepFrameBuffer *)(long)*(int *)&(pDVar10->super_Slice).field_0x34;
        in_stack_fffffffffffffbcf = bVar2;
        in_stack_fffffffffffffbd0 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d064b)
        ;
        fv = (in_stack_fffffffffffffbd0->super_Slice).fillValue;
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d0678);
        in_stack_fffffffffffffb40 = (pDVar10->super_Slice).xTileCoords & 1;
        pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1d06a2);
        in_stack_fffffffffffffb30 = in_stack_fffffffffffffbcf & 1;
        anon_unknown_8::TInSliceInfo::TInSliceInfo
                  (pTVar11,PVar1,pcVar8,local_3ec,xs,ys,(ptrdiff_t)in_stack_fffffffffffffb28,
                   SUB41(in_stack_fffffffffffffb30,0),false,fv,in_stack_fffffffffffffb40,
                   (pDVar10->super_Slice).yTileCoords & 1);
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
        ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                    (value_type *)in_stack_fffffffffffffb28);
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb28);
        bVar3 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                    (ConstIterator *)in_stack_fffffffffffffb28);
        local_46a = 0;
        if (bVar3) {
          local_46a = bVar2 ^ 0xff;
        }
        if ((local_46a & 1) != 0) {
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30))
          ;
        }
        DeepFrameBuffer::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      while( true ) {
        ChannelList::end((ChannelList *)in_stack_fffffffffffffb28);
        bVar2 = Imf_2_5::operator!=((ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                    (ConstIterator *)in_stack_fffffffffffffb28);
        if (!bVar2) break;
        pTVar11 = (TInSliceInfo *)operator_new(0x40);
        pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d0872);
        PVar1 = pCVar12->type;
        pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1d0891);
        in_stack_fffffffffffffb40 = 0;
        in_stack_fffffffffffffb30 = 0;
        in_stack_fffffffffffffb28 = (DeepFrameBuffer *)0x0;
        anon_unknown_8::TInSliceInfo::TInSliceInfo
                  (pTVar11,PVar1,(char *)0x0,pCVar12->type,0,0,0,false,true,0.0,0,0);
        std::
        vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
        ::push_back((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                    (value_type *)in_stack_fffffffffffffb28);
        ChannelList::ConstIterator::operator++
                  ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      }
      DeepFrameBuffer::operator=
                ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                 in_stack_fffffffffffffb28);
      for (local_270 = 0;
          sVar13 = std::
                   vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   ::size((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                           *)(*(long *)(in_RDI + 8) + 0x140)), local_270 < sVar13;
          local_270 = local_270 + 1) {
        ppTVar14 = std::
                   vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                                 *)(*(long *)(in_RDI + 8) + 0x140),local_270);
        if (*ppTVar14 != (value_type)0x0) {
          operator_delete(*ppTVar14,0x40);
        }
      }
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ::operator=((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   *)in_stack_fffffffffffffbd0,
                  (vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                   *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
      std::
      vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
      ::~vector((vector<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TInSliceInfo_*>_>
                 *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      IlmThread_2_5::Lock::~Lock
                ((Lock *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
      return;
    }
    DeepFrameBuffer::ConstIterator::name((ConstIterator *)0x1cfdde);
    local_60._M_node =
         (_Base_ptr)ChannelList::find(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    local_68._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_fffffffffffffb28);
    bVar2 = Imf_2_5::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                                (ConstIterator *)in_stack_fffffffffffffb28);
    if (!bVar2) {
      pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1cfe94);
      iVar4 = pCVar12->xSampling;
      pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1cfebd);
      if (iVar4 != (pDVar10->super_Slice).xSampling) {
LAB_001cff33:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1f0);
        poVar5 = std::operator<<(local_1e0,"X and/or y subsampling factors of \"");
        pcVar8 = ChannelList::ConstIterator::name((ConstIterator *)0x1cff76);
        poVar5 = std::operator<<(poVar5,pcVar8);
        poVar5 = std::operator<<(poVar5,"\" channel of input file \"");
        pcVar8 = fileName((DeepTiledInputFile *)0x1cffca);
        poVar5 = std::operator<<(poVar5,pcVar8);
        std::operator<<(poVar5,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar7,local_1f0);
        __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pCVar12 = ChannelList::ConstIterator::channel((ConstIterator *)0x1cfee8);
      iVar4 = pCVar12->ySampling;
      pDVar10 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1cff11);
      if (iVar4 != (pDVar10->super_Slice).ySampling) goto LAB_001cff33;
    }
    DeepFrameBuffer::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  } while( true );
}

Assistant:

void
DeepTiledInputFile::setFrameBuffer (const DeepFrameBuffer &frameBuffer)
{
    Lock lock (*_data->_streamData);

    //
    // Set the frame buffer
    //

    //
    // Check if the new frame buffer descriptor is
    // compatible with the image file header.
    //

    const ChannelList &channels = _data->header.channels();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        ChannelList::ConstIterator i = channels.find (j.name());

        if (i == channels.end())
            continue;

        if (i.channel().xSampling != j.slice().xSampling ||
            i.channel().ySampling != j.slice().ySampling)
            THROW (IEX_NAMESPACE::ArgExc, "X and/or y subsampling factors "
                                "of \"" << i.name() << "\" channel "
                                "of input file \"" << fileName() << "\" are "
                                "not compatible with the frame buffer's "
                                "subsampling factors.");
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = sampleCountSlice.xStride;
        _data->sampleCountYStride = sampleCountSlice.yStride;
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize the slice table for readPixels().
    //

    vector<TInSliceInfo*> slices;
    ChannelList::ConstIterator i = channels.begin();

    for (DeepFrameBuffer::ConstIterator j = frameBuffer.begin();
         j != frameBuffer.end();
         ++j)
    {
        while (i != channels.end() && strcmp (i.name(), j.name()) < 0)
        {
            //
            // Channel i is present in the file but not
            // in the frame buffer; data for channel i
            // will be skipped during readPixels().
            //

            slices.push_back (new TInSliceInfo (i.channel().type,
                                                NULL,
                                                i.channel().type,
                                                0,      // xStride
                                                0,      // yStride
                                                0,      // sampleStride
                                                false,  // fill
                                                true,   // skip
                                                0.0));  // fillValue
            ++i;
        }

        bool fill = false;

        if (i == channels.end() || strcmp (i.name(), j.name()) > 0)
        {
            //
            // Channel i is present in the frame buffer, but not in the file.
            // In the frame buffer, slice j will be filled with a default value.
            //

            fill = true;
        }

        slices.push_back (new TInSliceInfo (j.slice().type,
                                            j.slice().base,
                                            fill? j.slice().type: i.channel().type,
                                            j.slice().xStride,
                                            j.slice().yStride,
                                            j.slice().sampleStride,
                                            fill,
                                            false, // skip
                                            j.slice().fillValue,
                                            (j.slice().xTileCoords)? 1: 0,
                                            (j.slice().yTileCoords)? 1: 0));


        if (i != channels.end() && !fill)
            ++i;
    }

    // (TODO) inspect the following code. It's additional to the scanline input file.
    // Is this needed?

    while (i != channels.end())
    {
        //
        // Channel i is present in the file but not
        // in the frame buffer; data for channel i
        // will be skipped during readPixels().
        //

        slices.push_back (new TInSliceInfo (i.channel().type,
                                            NULL,
                                            i.channel().type,
                                            0, // xStride
                                            0, // yStride
                                            0, // sampleStride
                                            false,  // fill
                                            true, // skip
                                            0.0)); // fillValue
        ++i;
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size(); i++)
        delete _data->slices[i];
    _data->slices = slices;
}